

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::getBestAppending
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          int32_t missingFields,int32_t flags,UErrorCode *status,
          UDateTimePatternMatchOptions options)

{
  UBool UVar1;
  UDateTimePatternField field;
  int32_t iVar2;
  SimpleFormatter local_290;
  UnicodeString *local_248;
  UnicodeString *values [3];
  UnicodeString appendName;
  int32_t topField;
  int32_t foundMask;
  uint local_1a4;
  undefined1 local_1a0 [4];
  int32_t startingMask;
  UnicodeString local_160;
  undefined4 local_11c;
  PtnSkeleton *local_118;
  PtnSkeleton *specifiedSkeleton;
  int local_cc;
  UnicodeString *pUStack_c8;
  int32_t lastMissingFieldMask;
  UnicodeString *tempPatternPtr;
  undefined1 local_b0 [8];
  UnicodeString tempPattern;
  UnicodeString resultPattern;
  UDateTimePatternMatchOptions options_local;
  UErrorCode *status_local;
  int32_t flags_local;
  int32_t missingFields_local;
  DateTimePatternGenerator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&tempPattern.fUnion + 0x30));
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0);
  local_cc = 0;
  if (missingFields != 0) {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&specifiedSkeleton);
    icu_63::UnicodeString::operator=
              ((UnicodeString *)((long)&tempPattern.fUnion + 0x30),
               (UnicodeString *)&specifiedSkeleton);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&specifiedSkeleton);
    local_118 = (PtnSkeleton *)0x0;
    pUStack_c8 = getBestRaw(this,this->dtMatcher,missingFields,this->distanceInfo,status,&local_118)
    ;
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
      goto LAB_003ab260;
    }
    icu_63::UnicodeString::operator=((UnicodeString *)local_b0,pUStack_c8);
    adjustFieldTypes(&local_160,this,(UnicodeString *)local_b0,local_118,flags,options);
    icu_63::UnicodeString::operator=((UnicodeString *)((long)&tempPattern.fUnion + 0x30),&local_160)
    ;
    icu_63::UnicodeString::~UnicodeString(&local_160);
    if (this->distanceInfo->missingFieldMask == 0) {
      icu_63::UnicodeString::UnicodeString
                (__return_storage_ptr__,(UnicodeString *)((long)&tempPattern.fUnion + 0x30));
      goto LAB_003ab260;
    }
    while ((this->distanceInfo->missingFieldMask != 0 &&
           (local_cc != this->distanceInfo->missingFieldMask))) {
      if (((this->distanceInfo->missingFieldMask & 0x6000U) == 0x4000) &&
         ((missingFields & 0x6000U) == 0x6000)) {
        adjustFieldTypes((UnicodeString *)local_1a0,this,
                         (UnicodeString *)((long)&tempPattern.fUnion + 0x30),local_118,flags | 1,
                         options);
        icu_63::UnicodeString::operator=
                  ((UnicodeString *)((long)&tempPattern.fUnion + 0x30),(UnicodeString *)local_1a0);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1a0);
        this->distanceInfo->missingFieldMask = this->distanceInfo->missingFieldMask & 0xffffbfff;
      }
      else {
        local_1a4 = this->distanceInfo->missingFieldMask;
        pUStack_c8 = getBestRaw(this,this->dtMatcher,this->distanceInfo->missingFieldMask,
                                this->distanceInfo,status,&local_118);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 != '\0') {
          icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
          goto LAB_003ab260;
        }
        icu_63::UnicodeString::operator=((UnicodeString *)local_b0,pUStack_c8);
        adjustFieldTypes((UnicodeString *)&topField,this,(UnicodeString *)local_b0,local_118,flags,
                         options);
        icu_63::UnicodeString::operator=((UnicodeString *)local_b0,(UnicodeString *)&topField);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&topField);
        field = getTopBitNumber(this,local_1a4 & ~this->distanceInfo->missingFieldMask);
        iVar2 = icu_63::UnicodeString::length
                          ((UnicodeString *)(&this->field_0x108 + (long)(int)field * 0x40));
        if (iVar2 != 0) {
          icu_63::UnicodeString::UnicodeString((UnicodeString *)(values + 2));
          getAppendName(this,field,(UnicodeString *)(values + 2));
          local_248 = (UnicodeString *)((long)&tempPattern.fUnion + 0x30);
          values[0] = (UnicodeString *)local_b0;
          values[1] = (UnicodeString *)(values + 2);
          SimpleFormatter::SimpleFormatter
                    (&local_290,(UnicodeString *)(&this->field_0x108 + (long)(int)field * 0x40),2,3,
                     status);
          SimpleFormatter::formatAndReplace
                    (&local_290,&local_248,3,(UnicodeString *)((long)&tempPattern.fUnion + 0x30),
                     (int32_t *)0x0,0,status);
          SimpleFormatter::~SimpleFormatter(&local_290);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)(values + 2));
        }
        local_cc = this->distanceInfo->missingFieldMask;
      }
    }
  }
  icu_63::UnicodeString::UnicodeString
            (__return_storage_ptr__,(UnicodeString *)((long)&tempPattern.fUnion + 0x30));
LAB_003ab260:
  local_11c = 1;
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&tempPattern.fUnion + 0x30));
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::getBestAppending(int32_t missingFields, int32_t flags, UErrorCode &status, UDateTimePatternMatchOptions options) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString  resultPattern, tempPattern;
    const UnicodeString* tempPatternPtr;
    int32_t lastMissingFieldMask=0;
    if (missingFields!=0) {
        resultPattern=UnicodeString();
        const PtnSkeleton* specifiedSkeleton=nullptr;
        tempPatternPtr = getBestRaw(*dtMatcher, missingFields, distanceInfo, status, &specifiedSkeleton);
        if (U_FAILURE(status)) {
            return UnicodeString();
        }
        tempPattern = *tempPatternPtr;
        resultPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
        if ( distanceInfo->missingFieldMask==0 ) {
            return resultPattern;
        }
        while (distanceInfo->missingFieldMask!=0) { // precondition: EVERY single field must work!
            if ( lastMissingFieldMask == distanceInfo->missingFieldMask ) {
                break;  // cannot find the proper missing field
            }
            if (((distanceInfo->missingFieldMask & UDATPG_SECOND_AND_FRACTIONAL_MASK)==UDATPG_FRACTIONAL_MASK) &&
                ((missingFields & UDATPG_SECOND_AND_FRACTIONAL_MASK) == UDATPG_SECOND_AND_FRACTIONAL_MASK)) {
                resultPattern = adjustFieldTypes(resultPattern, specifiedSkeleton, flags | kDTPGFixFractionalSeconds, options);
                distanceInfo->missingFieldMask &= ~UDATPG_FRACTIONAL_MASK;
                continue;
            }
            int32_t startingMask = distanceInfo->missingFieldMask;
            tempPatternPtr = getBestRaw(*dtMatcher, distanceInfo->missingFieldMask, distanceInfo, status, &specifiedSkeleton);
            if (U_FAILURE(status)) {
                return UnicodeString();
            }
            tempPattern = *tempPatternPtr;
            tempPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
            int32_t foundMask=startingMask& ~distanceInfo->missingFieldMask;
            int32_t topField=getTopBitNumber(foundMask);

            if (appendItemFormats[topField].length() != 0) {
                UnicodeString appendName;
                getAppendName((UDateTimePatternField)topField, appendName);
                const UnicodeString *values[3] = {
                    &resultPattern,
                    &tempPattern,
                    &appendName
                };
                SimpleFormatter(appendItemFormats[topField], 2, 3, status).
                    formatAndReplace(values, 3, resultPattern, nullptr, 0, status);
            }
            lastMissingFieldMask = distanceInfo->missingFieldMask;
        }
    }
    return resultPattern;
}